

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

void __thiscall
protozero::CopyablePtr<perfetto::protos::gen::BeginImplFrameArgs_TimestampsInUs>::CopyablePtr
          (CopyablePtr<perfetto::protos::gen::BeginImplFrameArgs_TimestampsInUs> *this,
          CopyablePtr<perfetto::protos::gen::BeginImplFrameArgs_TimestampsInUs> *other)

{
  BeginImplFrameArgs_TimestampsInUs *this_00;
  CopyablePtr<perfetto::protos::gen::BeginImplFrameArgs_TimestampsInUs> *other_local;
  CopyablePtr<perfetto::protos::gen::BeginImplFrameArgs_TimestampsInUs> *this_local;
  
  perfetto::std::
  unique_ptr<perfetto::protos::gen::BeginImplFrameArgs_TimestampsInUs,_std::default_delete<perfetto::protos::gen::BeginImplFrameArgs_TimestampsInUs>_>
  ::unique_ptr(&this->ptr_,&other->ptr_);
  this_00 = (BeginImplFrameArgs_TimestampsInUs *)operator_new(0x68);
  perfetto::protos::gen::BeginImplFrameArgs_TimestampsInUs::BeginImplFrameArgs_TimestampsInUs
            (this_00);
  perfetto::std::
  unique_ptr<perfetto::protos::gen::BeginImplFrameArgs_TimestampsInUs,_std::default_delete<perfetto::protos::gen::BeginImplFrameArgs_TimestampsInUs>_>
  ::reset(&other->ptr_,this_00);
  return;
}

Assistant:

CopyablePtr(CopyablePtr&& other) noexcept : ptr_(std::move(other.ptr_)) {
    other.ptr_.reset(new T());
  }